

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O3

shared_ptr<Debugger> __thiscall
EmmyDebuggerManager::RemoveDebugger(EmmyDebuggerManager *this,lua_State *L)

{
  _Base_ptr p_Var1;
  int iVar2;
  lua_State *plVar3;
  _Base_ptr p_Var4;
  lua_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  const_iterator __position;
  shared_ptr<Debugger> sVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&L->hook);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (luaVersion == LUA_JIT) {
    plVar3 = (lua_State *)0x0;
  }
  else {
    plVar3 = GetMainState(in_RDX);
  }
  p_Var4 = (_Base_ptr)L[1].top.offset;
  if (p_Var4 != (_Base_ptr)0x0) {
    __position._M_node = (_Base_ptr)&L[1].tt;
    do {
      if (*(lua_State **)(p_Var4 + 1) >= plVar3) {
        __position._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(lua_State **)(p_Var4 + 1) < plVar3];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((__position._M_node != (_Base_ptr)&L[1].tt) &&
       (*(lua_State **)(__position._M_node + 1) <= plVar3)) {
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)__position._M_node[1]._M_parent;
      p_Var1 = __position._M_node[1]._M_left;
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
      if (p_Var1 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        }
      }
      std::
      _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
      ::_M_erase_aux((_Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
                      *)(L + 1),__position);
      goto LAB_0014a5f0;
    }
  }
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0014a5f0:
  pthread_mutex_unlock((pthread_mutex_t *)&L->hook);
  sVar5.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Debugger>)sVar5.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Debugger> EmmyDebuggerManager::RemoveDebugger(lua_State* L)
{
	std::lock_guard<std::mutex> lock(debuggerMtx);
	auto identify = GetUniqueIdentify(L);
	auto it = debuggers.find(identify);
	if (it != debuggers.end())
	{
		auto debugger = it->second;
		debuggers.erase(it);
		return debugger;
	}
	return nullptr;
}